

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O2

int zueci_gb18030_u(uchar *src,zueci_u32 len,uint flags,zueci_u32 *p_u)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  zueci_u32 zVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  zueci_u32 zVar13;
  
  bVar1 = *src;
  zVar13 = (zueci_u32)bVar1;
  if (-1 < (char)bVar1) {
    iVar6 = 1;
    goto LAB_001998c5;
  }
  if (len < 2) {
    return 0;
  }
  uVar12 = (uint)bVar1;
  if (uVar12 == 0x80) {
    return 0;
  }
  if (uVar12 == 0xff) {
    return 0;
  }
  iVar6 = zueci_gbk_u(src,len,flags,p_u);
  if (iVar6 != 0) {
    return iVar6;
  }
  bVar2 = src[1];
  if (((bVar1 < 0xe4) && (3 < len)) && ((byte)(bVar2 - 0x30) < 10)) {
    bVar3 = src[2];
    bVar4 = src[3];
    uVar11 = (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | uVar12 << 0x18 | (uint)bVar4;
    if (uVar11 < 0x81308130) {
      return 0;
    }
    if ((byte)(bVar4 - 0x3a) < 0xf6) {
      return 0;
    }
    if ((byte)(bVar3 + 1) < 0x82) {
      return 0;
    }
    if (0xe3329a35 < uVar11) {
      return 0;
    }
    if (uVar11 + 0x7bce5bc6 < 0xbfedcf6) {
      return 0;
    }
    iVar6 = 4;
    if (uVar11 == 0x8135f437) {
      zVar13 = 0xe7c7;
    }
    else if (bVar1 < 0x90) {
      iVar8 = 0;
      iVar10 = 0xcd;
      while (iVar9 = iVar10, iVar8 < iVar9) {
        iVar10 = iVar9 + iVar8 >> 1;
        if (zueci_gb18030_4_mb_e[iVar10] < uVar11) {
          iVar8 = iVar10 + 1;
          iVar10 = iVar9;
        }
      }
      uVar5 = zueci_gb18030_4_u_e[iVar8];
      zVar7 = zueci_gb18030_mb4_u(zueci_gb18030_4_mb_e[iVar8]);
      zVar13 = zueci_gb18030_mb4_u(uVar11);
      zVar13 = (uVar5 - zVar7) + zVar13;
    }
    else {
      zVar13 = ((uint)bVar4 + ((uVar12 * 10 + (uint)bVar2) * 0x7e + (uint)bVar3) * 10) - 0x1ba0fa;
    }
    goto LAB_001998c5;
  }
  if ((byte)(bVar2 + 1) < 0x41 || bVar2 == 0x7f) {
    return 0;
  }
  uVar12 = (uint)bVar1;
  if ((byte)(bVar1 + 0x56) < 6) {
    if (0xa0 < bVar2) goto LAB_001999ff;
LAB_001999b9:
    uVar11 = (uint)bVar2;
    if (0xa1 < bVar2 || 6 < (byte)(bVar1 + 0x5f)) {
      iVar6 = 2;
      if ((uVar12 == 0xfe) && ((byte)(bVar2 + 0xaf) < 0x41)) {
        if (bVar2 == 0x51) {
          zVar13 = 0x20087;
          goto LAB_001998c5;
        }
        if (bVar2 == 0x91) {
          zVar13 = 0x241fe;
          goto LAB_001998c5;
        }
        if (bVar2 == 0x53) {
          zVar13 = 0x200cc;
          goto LAB_001998c5;
        }
        if (uVar11 == 0x6c) {
          zVar13 = 0x215d7;
          goto LAB_001998c5;
        }
        if (uVar11 == 0x76) {
          zVar13 = 0x2298f;
          goto LAB_001998c5;
        }
        if (uVar11 == 0x52) {
          zVar13 = 0x20089;
          goto LAB_001998c5;
        }
      }
      if (0x5bf5 < (uVar12 * 0x100 + (uint)bVar2) - 0xa2ab) {
        return 0;
      }
      uVar11 = uVar12 * 0x100 | uVar11;
      iVar8 = 0xfe;
      iVar10 = 0;
      while( true ) {
        while( true ) {
          if (iVar8 < iVar10) {
            return 0;
          }
          iVar9 = iVar8 + iVar10 >> 1;
          if (uVar11 <= zueci_gb18030_2_mb_mb[iVar9]) break;
          iVar10 = iVar9 + 1;
        }
        if (zueci_gb18030_2_mb_mb[iVar9] <= uVar11) break;
        iVar8 = iVar9 + -1;
      }
      zVar13 = (zueci_u32)zueci_gb18030_2_mb_u[iVar9];
      goto LAB_001998c5;
    }
    zVar13 = (int)((char)bVar2 >> 7) + uVar12 * 0x60 + uVar11 + 0xa826;
  }
  else {
    if (bVar1 < 0xf8 || bVar2 < 0xa1) goto LAB_001999b9;
LAB_001999ff:
    iVar6 = uVar12 - 0xf2;
    if (bVar1 < 0xf8) {
      iVar6 = zVar13 - 0xaa;
    }
    zVar13 = iVar6 * 0x5e + (uint)bVar2 + 0xdf5f;
  }
  iVar6 = 2;
LAB_001998c5:
  *p_u = zVar13;
  return iVar6;
}

Assistant:

static int zueci_gb18030_u(const unsigned char *src, const zueci_u32 len, const unsigned int flags, zueci_u32 *p_u) {
    unsigned char c1, c2, c3, c4;
    int ret;
    zueci_u16 mb2;
    zueci_u32 mb4;

    (void)flags;
    assert(len);

    c1 = src[0];
    if (c1 < 0x80) {
        *p_u = c1;
        return 1;
    }
    if (len < 2 || c1 < 0x81 || c1 == 0xFF) {
        return 0;
    }
    if ((ret = zueci_gbk_u(src, len, 0 /*flags*/, p_u))) {
        return ret;
    }
    c2 = src[1];
    if (len >= 4 && c2 <= 0x39 && c2 >= 0x30 && c1 >= 0x81 && c1 <= 0xE3) {
        c3 = src[2];
        c4 = src[3];
        mb4 = ZUECI_4BYTES_U32(c1, c2, c3, c4);
        if (mb4 < 0x81308130 || (mb4 > 0x8431A439 && mb4 < 0x90308130) || mb4 > 0xE3329A35
                || c3 < 0x81 || c3 > 0xFE || c4 < 0x30 || c4 > 0x39) {
            return 0;
        }
        if (mb4 == 0x8135F437) { /* PUA change to non-PUA, see Table 3-39, Lunde, 2nd ed. */
            *p_u = 0xE7C7;
            return 4;
        }
        if (c1 >= 0x90) { /* Non-BMP */
            *p_u = 0x10000 + (((c1 - 0x90) * 10 + (c2 - 0x30)) * 126 + (c3 - 0x81)) * 10 + c4 - 0x30;
        } else { /* BMP */
            int s = 0;
            int e = ZUECI_ASIZE(zueci_gb18030_4_mb_e) - 1;
            while (s < e) { /* Lower bound */
                const int m = (s + e) >> 1;
                if (zueci_gb18030_4_mb_e[m] < mb4) {
                    s = m + 1;
                } else {
                    e = m;
                }
            }
            assert(s < ZUECI_ASIZE(zueci_gb18030_4_mb_e));
            *p_u = zueci_gb18030_4_u_e[s] - (zueci_gb18030_mb4_u(zueci_gb18030_4_mb_e[s]) - zueci_gb18030_mb4_u(mb4));
        }
        return 4;
    }
    if (c2 < 0x40 || c2 == 0x7F || c2 == 0xFF) {
        return 0;
    }
    if (((c1 >= 0xAA && c1 <= 0xAF) || (c1 >= 0xF8 && c1 <= 0xFE)) && c2 >= 0xA1 && c2 <= 0xFE) { /* UDA-1/2 PUA */
        *p_u = 0xE000 + (0xFF - 0xA0 - 1) * (c1 - (c1 >= 0xF8 ? 0xF2 : 0xAA)) + c2 - 0xA1;
        return 2;
    }
    if (c1 >= 0xA1 && c1 <= 0xA7 && c2 <= 0xA1) { /* UDA-3 PUA */
        *p_u = 0xE4C6 + (0xA1 - 0x40 - 1) * (c1 - 0xA1) + c2 - 0x40 - (c2 > 0x7F);
        return 2;
    }
    if (c1 == 0xFE && c2 >= 0x51 && c2 <= 0x91) {
        /* Non-BMP that were PUA, see Table 3-37, Lunde, 2nd ed. */
        if (c2 == 0x51) {
            *p_u = 0x20087;
            return 2;
        }
        if (c2 == 0x52) {
            *p_u = 0x20089;
            return 2;
        }
        if (c2 == 0x53) {
            *p_u = 0x200CC;
            return 2;
        }
        if (c2 == 0x6C) {
            *p_u = 0x215D7;
            return 2;
        }
        if (c2 == 0x76) {
            *p_u = 0x2298F;
            return 2;
        }
        if (c2 == 0x91) {
            *p_u = 0x241FE;
            return 2;
        }
    }
    mb2 = ((zueci_u16) c1 << 8) | c2;
    if (mb2 >= zueci_gb18030_2_mb_mb[0] && mb2 <= zueci_gb18030_2_mb_mb[ZUECI_ASIZE(zueci_gb18030_2_mb_mb) - 1]) {
        int s = 0;
        int e = ZUECI_ASIZE(zueci_gb18030_2_mb_mb) - 1;
        while (s <= e) {
            const int m = (s + e) >> 1;
            if (zueci_gb18030_2_mb_mb[m] < mb2) {
                s = m + 1;
            } else if (zueci_gb18030_2_mb_mb[m] > mb2) {
                e = m - 1;
            } else {
                *p_u = zueci_gb18030_2_mb_u[m];
                return 2;
            }
        }
    }
    return 0;
}